

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::noOverlapMerge
          (AlignmentRecord *this,BamAlignment *alignment,string *dna,string *qualities,
          string *nucigar,vector<char,_std::allocator<char>_> *cigar_temp_unrolled,int *c_pos,
          int *q_pos,int *ref_pos)

{
  char cVar1;
  char cVar2;
  
  cVar1 = (cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_start[*c_pos];
  cVar2 = (char)nucigar;
  switch(cVar1) {
  case 'D':
    std::__cxx11::string::push_back(cVar2);
  case 'H':
    q_pos = ref_pos;
    break;
  case 'E':
  case 'F':
  case 'G':
  case 'J':
  case 'K':
  case 'L':
    goto switchD_0018e5f0_caseD_45;
  case 'I':
    std::__cxx11::string::push_back((char)dna);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back(cVar2);
    break;
  case 'M':
    std::__cxx11::string::push_back((char)dna);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back(cVar2);
    goto LAB_0018e671;
  default:
    if (cVar1 != 'S') {
      return;
    }
LAB_0018e671:
    *ref_pos = *ref_pos + 1;
  }
  *q_pos = *q_pos + 1;
  *c_pos = *c_pos + 1;
switchD_0018e5f0_caseD_45:
  return;
}

Assistant:

void AlignmentRecord::noOverlapMerge(const BamTools::BamAlignment& alignment, std::string& dna, std::string& qualities, std::string& nucigar, std::vector<char>& cigar_temp_unrolled, int& c_pos, int& q_pos, int& ref_pos) const{
    char c = cigar_temp_unrolled[c_pos];
    if (c == 'H'){
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += alignment.QueryBases[q_pos];
        qualities += alignment.Qualities[q_pos];
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += alignment.QueryBases[q_pos];
        qualities += alignment.Qualities[q_pos];
        nucigar += c;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);
    }
}